

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O0

void __thiscall
ccel::udev::virtual_keyboard_handler::virtual_keyboard_handler
          (virtual_keyboard_handler *this,io_service *io,string *dev_name,int flags)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  ssize_t sVar5;
  runtime_error *prVar6;
  int in_ECX;
  string *in_RDX;
  undefined8 *in_RDI;
  uint i_1;
  int i;
  cons<bool,_boost::tuples::cons<int,_boost::tuples::null_type>_> *in_stack_ffffffffffffff58;
  tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *in_stack_ffffffffffffff60;
  io_service *in_stack_ffffffffffffff68;
  base_handler *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff78;
  unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
  *in_stack_ffffffffffffff80;
  uint local_44;
  uint local_30;
  
  base_handler::base_handler
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
  *in_RDI = &PTR_open_00150640;
  boost::unordered::
  unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
  ::unordered_map(in_stack_ffffffffffffff80);
  memset(in_RDI + 0xc,0,0x45c);
  std::__cxx11::string::string((string *)(in_RDI + 0x98),in_RDX);
  *(undefined1 *)((long)in_RDI + 0x4e4) = 1;
  iVar1 = ::open("/dev/uinput",in_ECX);
  *(int *)(in_RDI + 0x9c) = iVar1;
  ioctl(*(int *)(in_RDI + 0x9c),0x40045565,0x39);
  for (local_30 = 0; (int)local_30 < 0xf8; local_30 = local_30 + 1) {
    ioctl(*(int *)(in_RDI + 0x9c),0x40045565,(ulong)local_30);
    boost::tuples::make_tuple<bool,int>(&in_stack_ffffffffffffff58->head,(int *)0x134613);
    in_stack_ffffffffffffff80 =
         (unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
          *)boost::unordered::
            unordered_map<int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>_>
            ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    boost::tuples::
    tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
    ::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  ioctl(*(int *)(in_RDI + 0x9c),0x40045564,1);
  ioctl(*(int *)(in_RDI + 0x9c),0x40045564,2);
  local_44 = 0;
  while( true ) {
    uVar2 = (ulong)local_44;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar2) break;
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)(in_RDI + 0x98));
    *(undefined1 *)((long)in_RDI + (ulong)local_44 + 0x60) = *puVar4;
    local_44 = local_44 + 1;
  }
  *(undefined2 *)(in_RDI + 0x16) = 3;
  *(undefined2 *)((long)in_RDI + 0xb2) = 1;
  *(undefined2 *)((long)in_RDI + 0xb4) = 1;
  *(undefined2 *)((long)in_RDI + 0xb6) = 1;
  sVar5 = write(*(int *)(in_RDI + 0x9c),in_RDI + 0xc,0x45c);
  if (sVar5 < 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Write uinput file descriptor failed.");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = ioctl(*(int *)(in_RDI + 0x9c),0x5501);
  if (iVar1 != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Create virtual keyboard failed.");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

virtual_keyboard_handler::virtual_keyboard_handler(boost::asio::io_service &io,
                                                   const std::string dev_name,
                                                   const int flags)
    : base_handler(io, sizeof(virtual_keyboard_handler)), _udev{},
      _dev_name{dev_name}, _open(true) {
  // Init the udev handler
  // Open the uinput file descriptor
  _fd = ::open("/dev/uinput", flags);
  // NOTICE THAT THIS IS NOT ccel::base_handler::open()
  ioctl(_fd, UI_SET_KEYBIT, KEY_SPACE);
  for (auto i = 0; i < 248; i++) {
    ioctl(_fd, UI_SET_KEYBIT, i); // Bind and allow keycodes from 0 to 248
    __key_proprety[i] =
        boost::make_tuple(false, 20); // Default click time in  20 ms
  }
  ioctl(_fd, UI_SET_EVBIT, EV_KEY);
  ioctl(_fd, UI_SET_EVBIT, EV_REL);

  for (unsigned i = 0; i < _dev_name.length(); i++) {
    _udev.name[i] = _dev_name[i];
  }
  _udev.id.bustype = BUS_USB;
  _udev.id.vendor = 0x1;
  _udev.id.product = 0x1;
  _udev.id.version = 1;
  if (write(_fd, &_udev, sizeof(_udev)) < 0)
    throw std::runtime_error("Write uinput file descriptor failed.");
  if (ioctl(_fd, UI_DEV_CREATE) != 0) {
    throw std::runtime_error("Create virtual keyboard failed.");
  };
}